

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O0

int qtree_decode64(uchar *infile,LONGLONG *a,int n,int nqx,int nqy,int nbitplanes)

{
  int iVar1;
  uchar *a_00;
  double dVar2;
  double dVar3;
  int local_6c;
  uchar *scratch;
  int nqy2;
  int nqx2;
  int c;
  int nfy;
  int nfx;
  int ny;
  int nx;
  int nqmax;
  int b;
  int bit;
  int k;
  int log2n;
  int nbitplanes_local;
  int nqy_local;
  int nqx_local;
  int n_local;
  LONGLONG *a_local;
  uchar *infile_local;
  
  local_6c = nqy;
  if (nqy < nqx) {
    local_6c = nqx;
  }
  dVar2 = log((double)local_6c);
  dVar3 = log(2.0);
  bit = (int)(dVar2 / dVar3 + 0.5);
  if (1 << ((byte)bit & 0x1f) < local_6c) {
    bit = bit + 1;
  }
  a_00 = (uchar *)malloc((long)((nqx + 1) / 2) * (long)((nqy + 1) / 2));
  if (a_00 == (uchar *)0x0) {
    ffpmsg("qtree_decode64: insufficient memory");
    infile_local._4_4_ = 0x19e;
  }
  else {
    for (nqmax = nbitplanes + -1; -1 < nqmax; nqmax = nqmax + -1) {
      iVar1 = input_nybble(infile);
      if (iVar1 == 0) {
        read_bdirect64(infile,a,n,nqx,nqy,a_00,nqmax);
      }
      else {
        if (iVar1 != 0xf) {
          ffpmsg("qtree_decode64: bad format code");
          return 0x19e;
        }
        iVar1 = input_huffman(infile);
        *a_00 = (uchar)iVar1;
        nfx = 1;
        nfy = 1;
        nqy2 = 1 << ((byte)bit & 0x1f);
        nqx2 = nqy;
        c = nqx;
        for (b = 1; b < bit; b = b + 1) {
          nqy2 = nqy2 >> 1;
          nfx = nfx * 2;
          nfy = nfy * 2;
          if (nqy2 < c) {
            c = c - nqy2;
          }
          else {
            nfx = nfx + -1;
          }
          if (nqy2 < nqx2) {
            nqx2 = nqx2 - nqy2;
          }
          else {
            nfy = nfy + -1;
          }
          qtree_expand(infile,a_00,nfx,nfy,a_00);
        }
        qtree_bitins64(a_00,nqx,nqy,a,n,nqmax);
      }
    }
    free(a_00);
    infile_local._4_4_ = 0;
  }
  return infile_local._4_4_;
}

Assistant:

static int
qtree_decode64(unsigned char *infile, LONGLONG a[], int n, int nqx, int nqy, int nbitplanes)

/*
char *infile;
LONGLONG a[];				 a is 2-D array with dimensions (n,n)	
int n;					 length of full row in a				
int nqx;				 partial length of row to decode		
int nqy;				 partial length of column (<=n)		
int nbitplanes;				 number of bitplanes to decode		
*/
{
int log2n, k, bit, b, nqmax;
int nx,ny,nfx,nfy,c;
int nqx2, nqy2;
unsigned char *scratch;

	/*
	 * log2n is log2 of max(nqx,nqy) rounded up to next power of 2
	 */
	nqmax = (nqx>nqy) ? nqx : nqy;
	log2n = (int) (log((float) nqmax)/log(2.0)+0.5);
	if (nqmax > (1<<log2n)) {
		log2n += 1;
	}
	/*
	 * allocate scratch array for working space
	 */
	nqx2=(nqx+1)/2;
	nqy2=(nqy+1)/2;
	scratch = (unsigned char *) malloc((size_t)nqx2*nqy2);
	if (scratch == (unsigned char *) NULL) {
		ffpmsg("qtree_decode64: insufficient memory");
		return(DATA_DECOMPRESSION_ERR);
	}
	/*
	 * now decode each bit plane, starting at the top
	 * A is assumed to be initialized to zero
	 */
	for (bit = nbitplanes-1; bit >= 0; bit--) {
		/*
		 * Was bitplane was quadtree-coded or written directly?
		 */
		b = input_nybble(infile);

		if(b == 0) {
			/*
			 * bit map was written directly
			 */
			read_bdirect64(infile,a,n,nqx,nqy,scratch,bit);
		} else if (b != 0xf) {
			ffpmsg("qtree_decode64: bad format code");
			return(DATA_DECOMPRESSION_ERR);
		} else {
			/*
			 * bitmap was quadtree-coded, do log2n expansions
			 *
			 * read first code
			 */
			scratch[0] = input_huffman(infile);
			/*
			 * now do log2n expansions, reading codes from file as necessary
			 */
			nx = 1;
			ny = 1;
			nfx = nqx;
			nfy = nqy;
			c = 1<<log2n;
			for (k = 1; k<log2n; k++) {
				/*
				 * this somewhat cryptic code generates the sequence
				 * n[k-1] = (n[k]+1)/2 where n[log2n]=nqx or nqy
				 */
				c = c>>1;
				nx = nx<<1;
				ny = ny<<1;
				if (nfx <= c) { nx -= 1; } else { nfx -= c; }
				if (nfy <= c) { ny -= 1; } else { nfy -= c; }
				qtree_expand(infile,scratch,nx,ny,scratch);
			}
			/*
			 * now copy last set of 4-bit codes to bitplane bit of array a
			 */
			qtree_bitins64(scratch,nqx,nqy,a,n,bit);
		}
	}
	free(scratch);
	return(0);
}